

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeSTRPreImm(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint64_t Address_00;
  uint64_t Address_01;
  uint RegNo;
  
  RegNo = Insn >> 0x10 & 0xf;
  DVar1 = DecodeGPRRegisterClass(Inst,RegNo,Address,Decoder);
  if ((((DVar1 == MCDisassembler_Success) || (DVar1 == MCDisassembler_SoftFail)) &&
      ((DVar1 = DecodeGPRRegisterClass(Inst,Insn >> 0xc & 0xf,0,Decoder),
       DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) &&
     ((DVar1 = DecodeAddrModeImm12Operand
                         (Inst,Insn >> 0xb & 0x1000 | RegNo << 0xd | Insn & 0xfff,Address_00,Decoder
                         ), DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail))))
  {
    DVar1 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_01,Decoder);
    DVar1 = (*(code *)(&DAT_001ca13c + *(int *)(&DAT_001ca13c + (ulong)DVar1 * 4)))();
    return DVar1;
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeSTRPreImm(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned pred;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	imm |= fieldFromInstruction_4(Insn, 16, 4) << 13;
	imm |= fieldFromInstruction_4(Insn, 23, 1) << 12;
	pred = fieldFromInstruction_4(Insn, 28, 4);

	if (Rn == 0xF || Rn == Rt) S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeAddrModeImm12Operand(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}